

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristic_spatial_array.h
# Opt level: O2

ObjectSplit * __thiscall
embree::sse2::
HeuristicArraySpatialSAH<embree::sse2::QuadSplitterFactory,_embree::PrimRef,_32UL,_16UL>::
sequential_object_find
          (ObjectSplit *__return_storage_ptr__,
          HeuristicArraySpatialSAH<embree::sse2::QuadSplitterFactory,_embree::PrimRef,_32UL,_16UL>
          *this,PrimInfoExtRange *set,size_t logBlockSize,SplitInfo *info)

{
  BBox3fa *pBVar1;
  int *piVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar4;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar5;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar6;
  unsigned_long uVar7;
  unsigned_long uVar8;
  ulong uVar9;
  float *pfVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  ObjectSplit *s;
  undefined1 (*pauVar13) [16];
  size_t sVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  uint *puVar20;
  undefined8 *puVar21;
  PrimRef *pPVar22;
  size_t sVar23;
  ulong uVar24;
  long lVar25;
  bool bVar26;
  float fVar27;
  uint uVar28;
  undefined1 auVar29 [16];
  ulong uVar30;
  float fVar33;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar31;
  undefined1 auVar32 [16];
  int iVar34;
  int iVar36;
  int iVar37;
  undefined1 auVar35 [16];
  int iVar38;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar39;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar40;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar41;
  uint uVar43;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar42;
  float fVar44;
  float fVar45;
  float fVar46;
  uint uVar47;
  uint uVar48;
  uint uVar49;
  uint uVar50;
  uint uVar52;
  uint uVar53;
  uint uVar54;
  uint uVar55;
  uint uVar56;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar51;
  uint uVar57;
  float fVar58;
  float fVar59;
  ObjectBinner binner;
  vuint4 rCounts [32];
  vfloat4 rAreas [32];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_12d0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_12c0 [3];
  undefined1 local_1290 [8];
  float fStack_1288;
  uint uStack_1284;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_1280;
  undefined1 local_1270 [16];
  undefined1 local_1260 [16];
  undefined1 local_1250 [16];
  undefined1 local_1240 [16];
  undefined1 local_1230 [2976];
  int aiStack_690 [4];
  undefined8 local_680;
  int aiStack_678 [122];
  int aiStack_490 [8];
  int aiStack_470 [120];
  undefined8 uStack_290;
  float afStack_288 [6];
  float afStack_270 [144];
  
  puVar21 = &local_680;
  for (lVar17 = 0x50; lVar17 != 0xc50; lVar17 = lVar17 + 0x60) {
    *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
     ((anon_union_16_2_47237d3f_for_Vec3fa_0 *)(local_1290 + lVar17))->m128 = _DAT_01f45a30;
    *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)((long)&local_1280 + lVar17) = _DAT_01f45a40;
    *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
     ((anon_union_16_2_47237d3f_for_Vec3fa_0 *)((long)local_12c0 + lVar17 + 0x10))->m128 =
         _DAT_01f45a30;
    *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)((long)local_12c0 + lVar17 + 0x20) = _DAT_01f45a40;
    *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
     ((anon_union_16_2_47237d3f_for_Vec3fa_0 *)((long)&local_12d0 + lVar17))->m128 = _DAT_01f45a30;
    *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)((long)local_12c0 + lVar17) = _DAT_01f45a40;
    *puVar21 = 0;
    puVar21[1] = 0;
    puVar21 = puVar21 + 2;
  }
  uVar7 = (set->super_extended_range<unsigned_long>).super_range<unsigned_long>._end;
  uVar8 = (set->super_extended_range<unsigned_long>).super_range<unsigned_long>._begin;
  fVar27 = (float)(uVar7 - uVar8) * 0.05 + 4.0;
  uVar18 = (ulong)fVar27;
  uVar18 = (long)(fVar27 - 9.223372e+18) & (long)uVar18 >> 0x3f | uVar18;
  uVar19 = 0x20;
  if (uVar18 < 0x20) {
    uVar19 = uVar18;
  }
  pBVar1 = &(set->super_CentGeomBBox3fa).centBounds;
  fVar27 = (pBVar1->lower).field_0.m128[0];
  fVar44 = (set->super_CentGeomBBox3fa).centBounds.lower.field_0.m128[1];
  uVar11 = *(undefined8 *)&(pBVar1->lower).field_0;
  pfVar10 = (set->super_CentGeomBBox3fa).centBounds.lower.field_0.m128 + 2;
  fVar45 = *pfVar10;
  uVar12 = *(undefined8 *)pfVar10;
  auVar29._0_4_ = (set->super_CentGeomBBox3fa).centBounds.upper.field_0.m128[0] - fVar27;
  auVar29._4_4_ = (set->super_CentGeomBBox3fa).centBounds.upper.field_0.m128[1] - fVar44;
  auVar29._8_4_ = (set->super_CentGeomBBox3fa).centBounds.upper.field_0.m128[2] - fVar45;
  auVar29._12_4_ =
       (set->super_CentGeomBBox3fa).centBounds.upper.field_0.m128[3] -
       (set->super_CentGeomBBox3fa).centBounds.lower.field_0.m128[3];
  auVar29 = maxps(_DAT_01f46b30,auVar29);
  auVar35._0_4_ = (float)(long)uVar19 * 0.99;
  auVar35._4_4_ = auVar35._0_4_;
  auVar35._8_4_ = auVar35._0_4_;
  auVar35._12_4_ = auVar35._0_4_;
  auVar35 = divps(auVar35,auVar29);
  local_1290._0_4_ = -(uint)((float)DAT_01f46b30 < auVar29._0_4_) & auVar35._0_4_;
  local_1290._4_4_ = -(uint)(DAT_01f46b30._4_4_ < auVar29._4_4_) & auVar35._4_4_;
  fStack_1288 = (float)(-(uint)(DAT_01f46b30._8_4_ < auVar29._8_4_) & auVar35._8_4_);
  uStack_1284 = -(uint)(DAT_01f46b30._12_4_ < auVar29._12_4_) & auVar35._12_4_;
  uVar18 = uVar7 - uVar8;
  if (uVar18 != 0) {
    pPVar22 = this->prims0 + uVar8;
    uVar15 = (int)uVar19 - 1;
    for (uVar16 = 0; uVar16 < uVar18 - 1; uVar16 = uVar16 + 2) {
      aVar3 = (pPVar22->lower).field_0.field_1;
      aVar4 = (pPVar22->upper).field_0.field_1;
      aVar5 = pPVar22[1].lower.field_0.field_1;
      aVar6 = pPVar22[1].upper.field_0.field_1;
      uVar47 = (uint)(((aVar3.x + aVar4.x) - fVar27) * (float)local_1290._0_4_ + -0.5);
      uVar48 = (uint)(((aVar3.y + aVar4.y) - fVar44) * (float)local_1290._4_4_ + -0.5);
      uVar49 = (uint)(((aVar3.z + aVar4.z) - fVar45) * fStack_1288 + -0.5);
      uVar50 = -(uint)((int)uVar15 < (int)uVar47);
      uVar52 = -(uint)((int)uVar15 < (int)uVar48);
      uVar54 = -(uint)((int)uVar15 < (int)uVar49);
      uVar50 = ~uVar50 & uVar47 | uVar15 & uVar50;
      uVar43 = ~uVar52 & uVar48 | uVar15 & uVar52;
      uVar28 = ~uVar54 & uVar49 | uVar15 & uVar54;
      uVar52 = (uint)(((aVar5.x + aVar6.x) - fVar27) * (float)local_1290._0_4_ + -0.5);
      uVar54 = (uint)(((aVar5.y + aVar6.y) - fVar44) * (float)local_1290._4_4_ + -0.5);
      uVar55 = (uint)(((aVar5.z + aVar6.z) - fVar45) * fStack_1288 + -0.5);
      uVar47 = -(uint)((int)uVar15 < (int)uVar52);
      uVar48 = -(uint)((int)uVar15 < (int)uVar54);
      uVar49 = -(uint)((int)uVar15 < (int)uVar55);
      uVar47 = ~uVar47 & uVar52 | uVar15 & uVar47;
      uVar48 = ~uVar48 & uVar54 | uVar15 & uVar48;
      uVar49 = ~uVar49 & uVar55 | uVar15 & uVar49;
      uVar24 = (ulong)(-(uint)(0 < (int)uVar50) & uVar50);
      auVar29 = *(undefined1 (*) [16])(local_1270 + uVar24 * 0x60);
      aVar51.m128 = (__m128)minps((&local_1280)[uVar24 * 6],(undefined1  [16])aVar3);
      (&local_1280)[uVar24 * 6] = aVar51;
      auVar29 = maxps(auVar29,(undefined1  [16])aVar4);
      *(undefined1 (*) [16])(local_1270 + uVar24 * 0x60) = auVar29;
      uVar30 = (ulong)(-(uint)(0 < (int)uVar43) & uVar43);
      lVar17 = uVar30 * 0x60;
      auVar29 = minps(*(undefined1 (*) [16])(local_1260 + lVar17),(undefined1  [16])aVar3);
      *(undefined1 (*) [16])(local_1260 + lVar17) = auVar29;
      auVar29 = maxps(*(undefined1 (*) [16])(local_1250 + lVar17),(undefined1  [16])aVar4);
      *(undefined1 (*) [16])(local_1250 + lVar17) = auVar29;
      uVar9 = (ulong)(-(uint)(0 < (int)uVar28) & uVar28);
      lVar17 = uVar9 * 0x60;
      auVar29 = minps(*(undefined1 (*) [16])(local_1240 + lVar17),(undefined1  [16])aVar3);
      *(undefined1 (*) [16])(local_1240 + lVar17) = auVar29;
      auVar29 = maxps(*(undefined1 (*) [16])(local_1230 + lVar17),(undefined1  [16])aVar4);
      *(undefined1 (*) [16])(local_1230 + lVar17) = auVar29;
      piVar2 = (int *)(&local_680 + uVar24 * 2);
      *piVar2 = *piVar2 + 1;
      piVar2 = (int *)((long)&local_680 + uVar30 * 0x10 + 4);
      *piVar2 = *piVar2 + 1;
      aiStack_678[uVar9 * 4] = aiStack_678[uVar9 * 4] + 1;
      uVar24 = (ulong)(-(uint)(0 < (int)uVar47) & uVar47);
      auVar29 = *(undefined1 (*) [16])(local_1270 + uVar24 * 0x60);
      aVar51.m128 = (__m128)minps((&local_1280)[uVar24 * 6],(undefined1  [16])aVar5);
      (&local_1280)[uVar24 * 6] = aVar51;
      auVar29 = maxps(auVar29,(undefined1  [16])aVar6);
      *(undefined1 (*) [16])(local_1270 + uVar24 * 0x60) = auVar29;
      uVar30 = (ulong)(-(uint)(0 < (int)uVar48) & uVar48);
      lVar17 = uVar30 * 0x60;
      auVar29 = minps(*(undefined1 (*) [16])(local_1260 + lVar17),(undefined1  [16])aVar5);
      *(undefined1 (*) [16])(local_1260 + lVar17) = auVar29;
      auVar29 = maxps(*(undefined1 (*) [16])(local_1250 + lVar17),(undefined1  [16])aVar6);
      *(undefined1 (*) [16])(local_1250 + lVar17) = auVar29;
      uVar9 = (ulong)(-(uint)(0 < (int)uVar49) & uVar49);
      lVar17 = uVar9 * 0x60;
      auVar29 = minps(*(undefined1 (*) [16])(local_1240 + lVar17),(undefined1  [16])aVar5);
      *(undefined1 (*) [16])(local_1240 + lVar17) = auVar29;
      auVar29 = maxps(*(undefined1 (*) [16])(local_1230 + lVar17),(undefined1  [16])aVar6);
      *(undefined1 (*) [16])(local_1230 + lVar17) = auVar29;
      piVar2 = (int *)(&local_680 + uVar24 * 2);
      *piVar2 = *piVar2 + 1;
      piVar2 = (int *)((long)&local_680 + uVar30 * 0x10 + 4);
      *piVar2 = *piVar2 + 1;
      aiStack_678[uVar9 * 4] = aiStack_678[uVar9 * 4] + 1;
      pPVar22 = pPVar22 + 2;
    }
    if (uVar16 < uVar18) {
      aVar3 = (pPVar22->lower).field_0.field_1;
      aVar4 = (pPVar22->upper).field_0.field_1;
      uVar47 = (uint)(((aVar3.x + aVar4.x) - fVar27) * (float)local_1290._0_4_ + -0.5);
      uVar48 = (uint)(((aVar3.y + aVar4.y) - fVar44) * (float)local_1290._4_4_ + -0.5);
      uVar49 = (uint)(((aVar3.z + aVar4.z) - fVar45) * fStack_1288 + -0.5);
      uVar50 = -(uint)((int)uVar15 < (int)uVar47);
      uVar52 = -(uint)((int)uVar15 < (int)uVar48);
      uVar43 = -(uint)((int)uVar15 < (int)uVar49);
      uVar47 = ~uVar50 & uVar47 | uVar15 & uVar50;
      uVar48 = ~uVar52 & uVar48 | uVar15 & uVar52;
      uVar15 = ~uVar43 & uVar49 | uVar15 & uVar43;
      uVar18 = (ulong)(-(uint)(0 < (int)uVar47) & uVar47);
      piVar2 = (int *)(&local_680 + uVar18 * 2);
      *piVar2 = *piVar2 + 1;
      auVar29 = *(undefined1 (*) [16])(local_1270 + uVar18 * 0x60);
      aVar51.m128 = (__m128)minps((&local_1280)[uVar18 * 6],(undefined1  [16])aVar3);
      (&local_1280)[uVar18 * 6] = aVar51;
      auVar29 = maxps(auVar29,(undefined1  [16])aVar4);
      *(undefined1 (*) [16])(local_1270 + uVar18 * 0x60) = auVar29;
      uVar18 = (ulong)(-(uint)(0 < (int)uVar48) & uVar48);
      lVar17 = uVar18 * 0x60;
      piVar2 = (int *)((long)&local_680 + uVar18 * 0x10 + 4);
      *piVar2 = *piVar2 + 1;
      auVar29 = minps(*(undefined1 (*) [16])(local_1260 + lVar17),(undefined1  [16])aVar3);
      *(undefined1 (*) [16])(local_1260 + lVar17) = auVar29;
      auVar29 = maxps(*(undefined1 (*) [16])(local_1250 + lVar17),(undefined1  [16])aVar4);
      *(undefined1 (*) [16])(local_1250 + lVar17) = auVar29;
      uVar18 = (ulong)(-(uint)(0 < (int)uVar15) & uVar15);
      lVar17 = uVar18 * 0x60;
      aiStack_678[uVar18 * 4] = aiStack_678[uVar18 * 4] + 1;
      auVar29 = minps(*(undefined1 (*) [16])(local_1240 + lVar17),(undefined1  [16])aVar3);
      *(undefined1 (*) [16])(local_1240 + lVar17) = auVar29;
      auVar29 = maxps(*(undefined1 (*) [16])(local_1230 + lVar17),(undefined1  [16])aVar4);
      *(undefined1 (*) [16])(local_1230 + lVar17) = auVar29;
    }
  }
  pauVar13 = (undefined1 (*) [16])(local_1290 + uVar19 * 0x60);
  lVar17 = uVar19 * 0x10;
  iVar34 = 0;
  iVar36 = 0;
  iVar37 = 0;
  iVar38 = 0;
  lVar25 = 0;
  aVar51 = _DAT_01f45a30;
  aVar31 = _DAT_01f45a40;
  aVar39 = _DAT_01f45a30;
  aVar40 = _DAT_01f45a40;
  aVar41 = _DAT_01f45a30;
  aVar42 = _DAT_01f45a40;
  uVar18 = uVar19;
  while (uVar18 = uVar18 - 1, uVar18 != 0) {
    piVar2 = (int *)((long)aiStack_690 + lVar25 + lVar17);
    iVar34 = iVar34 + *piVar2;
    iVar36 = iVar36 + piVar2[1];
    iVar37 = iVar37 + piVar2[2];
    iVar38 = iVar38 + piVar2[3];
    aVar41.m128 = (__m128)minps(aVar41.m128,pauVar13[-5]);
    aVar42.m128 = (__m128)maxps(aVar42.m128,pauVar13[-4]);
    aVar39.m128 = (__m128)minps(aVar39.m128,pauVar13[-3]);
    fVar27 = aVar42.m128[1] - aVar41.m128[1];
    fVar44 = aVar42.m128[2] - aVar41.m128[2];
    aVar40.m128 = (__m128)maxps(aVar40.m128,pauVar13[-2]);
    fVar45 = aVar40.m128[1] - aVar39.m128[1];
    fVar46 = aVar40.m128[2] - aVar39.m128[2];
    aVar51.m128 = (__m128)minps(aVar51.m128,pauVar13[-1]);
    aVar31.m128 = (__m128)maxps(aVar31.m128,*pauVar13);
    *(ulong *)((long)&uStack_290 + lVar25 + lVar17) =
         CONCAT44((aVar40.m128[0] - aVar39.m128[0]) * (fVar45 + fVar46) + fVar46 * fVar45,
                  (aVar42.m128[0] - aVar41.m128[0]) * (fVar27 + fVar44) + fVar44 * fVar27);
    fVar27 = aVar31.m128[1] - aVar51.m128[1];
    fVar44 = aVar31.m128[2] - aVar51.m128[2];
    *(float *)((long)afStack_288 + lVar25 + lVar17) =
         (fVar27 + fVar44) * (aVar31.m128[0] - aVar51.m128[0]) + fVar44 * fVar27;
    *(undefined4 *)((long)afStack_288 + lVar25 + lVar17 + 4) = 0;
    piVar2 = (int *)((long)aiStack_490 + lVar25 + lVar17);
    *piVar2 = iVar34;
    piVar2[1] = iVar36;
    piVar2[2] = iVar37;
    piVar2[3] = iVar38;
    pauVar13 = pauVar13 + -6;
    lVar25 = lVar25 + -0x10;
  }
  uVar18 = 0xffffffffffffffff;
  uVar15 = ~(-1 << ((byte)logBlockSize & 0x1f));
  uVar47 = 1;
  uVar48 = 1;
  uVar49 = 1;
  uVar50 = 1;
  local_12d0.m128[0] = 0.0;
  local_12d0.m128[1] = 0.0;
  local_12d0.m128[2] = 0.0;
  local_12d0.m128[3] = 0.0;
  pauVar13 = (undefined1 (*) [16])local_1230;
  lVar17 = 0;
  iVar34 = 0;
  iVar36 = 0;
  iVar37 = 0;
  iVar38 = 0;
  aVar51 = _DAT_01f45a40;
  aVar31 = _DAT_01f45a40;
  aVar39 = _DAT_01f45a40;
  local_12c0[0] = _DAT_01f45a30;
  aVar40 = _DAT_01f45a30;
  aVar41 = _DAT_01f45a30;
  aVar42 = _DAT_01f45a30;
  for (uVar16 = 1; uVar16 < uVar19; uVar16 = uVar16 + 1) {
    aVar42.m128 = (__m128)minps(aVar42.m128,pauVar13[-5]);
    aVar39.m128 = (__m128)maxps(aVar39.m128,pauVar13[-4]);
    aVar41.m128 = (__m128)minps(aVar41.m128,pauVar13[-3]);
    aVar51.m128 = (__m128)maxps(aVar51.m128,pauVar13[-2]);
    fVar58 = aVar39.m128[1] - aVar42.m128[1];
    fVar59 = aVar39.m128[2] - aVar42.m128[2];
    aVar40.m128 = (__m128)minps(aVar40.m128,pauVar13[-1]);
    fVar46 = aVar51.m128[1] - aVar41.m128[1];
    fVar33 = aVar51.m128[2] - aVar41.m128[2];
    aVar31.m128 = (__m128)maxps(aVar31.m128,*pauVar13);
    fVar27 = aVar31.m128[0] - aVar40.m128[0];
    fVar44 = aVar31.m128[1] - aVar40.m128[1];
    fVar45 = aVar31.m128[2] - aVar40.m128[2];
    iVar34 = iVar34 + *(int *)((long)&local_680 + lVar17);
    iVar36 = iVar36 + *(int *)((long)&local_680 + lVar17 + 4);
    iVar37 = iVar37 + *(int *)((long)aiStack_678 + lVar17);
    iVar38 = iVar38 + *(int *)((long)aiStack_678 + lVar17 + 4);
    uVar30 = logBlockSize & 0xffffffff;
    uVar52 = iVar34 + uVar15 >> uVar30;
    uVar43 = iVar36 + uVar15 >> uVar30;
    uVar54 = iVar37 + uVar15 >> uVar30;
    uVar28 = iVar38 + uVar15 >> uVar30;
    uVar55 = *(int *)((long)aiStack_470 + lVar17) + uVar15 >> uVar30;
    uVar53 = *(int *)((long)aiStack_470 + lVar17 + 4) + uVar15 >> uVar30;
    uVar56 = *(int *)((long)aiStack_470 + lVar17 + 8) + uVar15 >> uVar30;
    uVar57 = *(int *)((long)aiStack_470 + lVar17 + 0xc) + uVar15 >> uVar30;
    auVar32._0_4_ =
         ((float)(uVar55 & 0x7fffffff) + (float)((int)uVar55 >> 0x1f & 0x4f000000)) *
         *(float *)((long)afStack_270 + lVar17) +
         ((float)(uVar52 & 0x7fffffff) + (float)((int)uVar52 >> 0x1f & 0x4f000000)) *
         ((aVar39.m128[0] - aVar42.m128[0]) * (fVar58 + fVar59) + fVar59 * fVar58);
    auVar32._4_4_ =
         ((float)(uVar53 & 0x7fffffff) + (float)((int)uVar53 >> 0x1f & 0x4f000000)) *
         *(float *)((long)afStack_270 + lVar17 + 4) +
         ((float)(uVar43 & 0x7fffffff) + (float)((int)uVar43 >> 0x1f & 0x4f000000)) *
         ((aVar51.m128[0] - aVar41.m128[0]) * (fVar46 + fVar33) + fVar33 * fVar46);
    auVar32._8_4_ =
         ((float)(uVar56 & 0x7fffffff) + (float)((int)uVar56 >> 0x1f & 0x4f000000)) *
         *(float *)((long)afStack_270 + lVar17 + 8) +
         ((float)(uVar54 & 0x7fffffff) + (float)((int)uVar54 >> 0x1f & 0x4f000000)) *
         (fVar27 * (fVar45 + fVar44) + fVar44 * fVar45);
    auVar32._12_4_ =
         ((float)(uVar57 & 0x7fffffff) + (float)((int)uVar57 >> 0x1f & 0x4f000000)) *
         *(float *)((long)afStack_270 + lVar17 + 0xc) +
         ((float)(uVar28 & 0x7fffffff) + (float)((int)uVar28 >> 0x1f & 0x4f000000)) *
         (fVar27 * (fVar44 + fVar45) + fVar45 * fVar44);
    uVar52 = -(uint)(local_12c0[0].m128[0] <= auVar32._0_4_);
    uVar43 = -(uint)(local_12c0[0].m128[1] <= auVar32._4_4_);
    uVar54 = -(uint)(local_12c0[0].m128[2] <= auVar32._8_4_);
    uVar28 = -(uint)(local_12c0[0].m128[3] <= auVar32._12_4_);
    local_12d0.m128[0] = (float)((uint)local_12d0.m128[0] & uVar52 | ~uVar52 & uVar47);
    local_12d0.m128[1] = (float)((uint)local_12d0.m128[1] & uVar43 | ~uVar43 & uVar48);
    local_12d0.m128[2] = (float)((uint)local_12d0.m128[2] & uVar54 | ~uVar54 & uVar49);
    local_12d0.m128[3] = (float)((uint)local_12d0.m128[3] & uVar28 | ~uVar28 & uVar50);
    local_12c0[0].m128 = (__m128)minps(auVar32,local_12c0[0].m128);
    uVar47 = uVar47 + 1;
    uVar48 = uVar48 + 1;
    uVar49 = uVar49 + 1;
    uVar50 = uVar50 + 1;
    lVar17 = lVar17 + 0x10;
    pauVar13 = pauVar13 + 6;
  }
  fVar44 = INFINITY;
  fVar27 = 0.0;
  for (uVar16 = 0; uVar16 != 3; uVar16 = uVar16 + 1) {
    if ((((*(float *)(local_1290 + uVar16 * 4) != 0.0) || (NAN(*(float *)(local_1290 + uVar16 * 4)))
         ) && (fVar45 = *(float *)((long)local_12c0 + uVar16 * 4), fVar45 < fVar44)) &&
       (local_12d0.m128[uVar16] != 0.0)) {
      uVar18 = uVar16 & 0xffffffff;
      fVar27 = local_12d0.m128[uVar16];
      fVar44 = fVar45;
    }
  }
  __return_storage_ptr__->sah = fVar44;
  iVar34 = (int)uVar18;
  __return_storage_ptr__->dim = iVar34;
  (__return_storage_ptr__->field_2).pos = (int)fVar27;
  __return_storage_ptr__->data = 0;
  (__return_storage_ptr__->mapping).num = uVar19;
  *(undefined8 *)&(__return_storage_ptr__->mapping).ofs.field_0 = uVar11;
  *(undefined8 *)((long)&(__return_storage_ptr__->mapping).ofs.field_0 + 8) = uVar12;
  *(ulong *)&(__return_storage_ptr__->mapping).scale.field_0 =
       CONCAT44(local_1290._4_4_,local_1290._0_4_);
  *(ulong *)((long)&(__return_storage_ptr__->mapping).scale.field_0 + 8) =
       CONCAT44(uStack_1284,fStack_1288);
  if (iVar34 == -1) {
    info->leftCount = 0;
    info->rightCount = 0;
    aVar51 = _DAT_01f45a30;
    (info->leftBounds).lower.field_0 = _DAT_01f45a30;
    aVar31 = _DAT_01f45a40;
    aVar39 = _DAT_01f45a40;
  }
  else {
    uVar16 = (ulong)(int)fVar27;
    lVar17 = (long)iVar34;
    puVar20 = (uint *)((long)&local_680 + lVar17 * 4);
    pauVar13 = (undefined1 (*) [16])(local_1270 + lVar17 * 0x20);
    sVar14 = 0;
    uVar18 = uVar16;
    aVar31 = _DAT_01f45a40;
    aVar40 = _DAT_01f45a30;
    while (bVar26 = uVar18 != 0, uVar18 = uVar18 - 1, bVar26) {
      sVar14 = sVar14 + *puVar20;
      aVar40.m128 = (__m128)minps(aVar40.m128,pauVar13[-1]);
      aVar31.m128 = (__m128)maxps(aVar31.m128,*pauVar13);
      puVar20 = puVar20 + 4;
      pauVar13 = pauVar13 + 6;
    }
    puVar20 = (uint *)((long)&local_680 + uVar16 * 0x10 + lVar17 * 4);
    pauVar13 = (undefined1 (*) [16])(local_1270 + uVar16 * 0x60 + lVar17 * 0x20);
    sVar23 = 0;
    aVar51 = _DAT_01f45a30;
    aVar39 = _DAT_01f45a40;
    for (; uVar16 < uVar19; uVar16 = uVar16 + 1) {
      aVar51.m128 = (__m128)minps(aVar51.m128,pauVar13[-1]);
      aVar39.m128 = (__m128)maxps(aVar39.m128,*pauVar13);
      sVar23 = sVar23 + *puVar20;
      puVar20 = puVar20 + 4;
      pauVar13 = pauVar13 + 6;
    }
    info->leftCount = sVar14;
    info->rightCount = sVar23;
    (info->leftBounds).lower.field_0 = aVar40;
  }
  (info->leftBounds).upper.field_0 = aVar31;
  (info->rightBounds).lower.field_0 = aVar51;
  (info->rightBounds).upper.field_0 = aVar39;
  return __return_storage_ptr__;
}

Assistant:

sequential_object_find(const PrimInfoExtRange& set, const size_t logBlockSize, SplitInfo &info)
        {
          ObjectBinner binner(empty); 
          const BinMapping<OBJECT_BINS> mapping(set);
          binner.bin(prims0,set.begin(),set.end(),mapping);
          ObjectSplit s = binner.best(mapping,logBlockSize);
          binner.getSplitInfo(mapping, s, info);
          return s;
        }